

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O3

void __thiscall
dlib::image_window::on_keydown
          (image_window *this,unsigned_long key,bool is_printable,unsigned_long state)

{
  mutex *__mutex;
  
  drawable_window::on_keydown(&this->super_drawable_window,key,is_printable,state);
  this->have_last_keypress = true;
  this->next_key = key;
  this->next_is_printable = is_printable;
  this->next_state = state;
  __mutex = &(this->clicked_signaler).m;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  pthread_cond_signal((pthread_cond_t *)&(this->clicked_signaler).s.cond);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void image_window::
    on_keydown (
        unsigned long key,
        bool is_printable,
        unsigned long state
    )
    {
        dlib::drawable_window::on_keydown(key,is_printable,state);

        have_last_keypress = true;
        next_key = key;
        next_is_printable = is_printable;
        next_state = state;
        clicked_signaler.signal();
    }